

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSparsifyInternal(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  int nFanins;
  DdManager *dd;
  uint uVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pObj;
  DdNode *n;
  Abc_Obj_t *pAVar4;
  char *pSuffix;
  long lVar5;
  ulong uVar6;
  DdNode *bFunc;
  int iVar7;
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
  for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar7);
    Abc_NtkDupObj(pNtk_00,pAVar2,1);
  }
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar3;
  dd = (DdManager *)pNtk_00->pManFunc;
  Cudd_bddIthVar(dd,pNtk->vCis->nSize + -1);
  iVar7 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar7) {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      return pNtk_00;
    }
    pObj = Abc_NtkCo(pNtk,iVar7);
    pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    uVar1 = *(uint *)&pAVar2->field_0x14 & 0xf;
    if ((uVar1 == 5) || (uVar1 == 2)) {
      Abc_NtkDupObj(pNtk_00,pObj,0);
      Abc_ObjAddFanin((pObj->field_6).pCopy,
                      (Abc_Obj_t *)
                      ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
                      (ulong)(pAVar2->field_6).pTemp));
      pAVar4 = (pObj->field_6).pCopy;
      pcVar3 = Abc_ObjName(pObj);
      Abc_ObjAssignName(pAVar4,pcVar3,"_on");
      Abc_NtkDupObj(pNtk_00,pObj,0);
      pAVar4 = (pObj->field_6).pCopy;
      pAVar2 = (Abc_Obj_t *)
               ((ulong)((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) ^
               (ulong)(pAVar2->field_6).pTemp);
LAB_0027e33f:
      Abc_ObjAddFanin(pAVar4,pAVar2);
      pAVar2 = (pObj->field_6).pCopy;
      pcVar3 = Abc_ObjName(pObj);
      Abc_ObjAssignName(pAVar2,pcVar3,"_off");
    }
    else {
      if ((pAVar2->vFanins).nSize == 0) {
        Abc_NtkDupObj(pNtk_00,pObj,0);
        pAVar2 = (pObj->field_6).pCopy;
        if ((pObj->field_0x15 & 4) == 0) {
          pAVar4 = Abc_NtkCreateNodeConst1(pNtk_00);
        }
        else {
          pAVar4 = Abc_NtkCreateNodeConst0(pNtk_00);
        }
        Abc_ObjAddFanin(pAVar2,pAVar4);
        pAVar2 = (pObj->field_6).pCopy;
        pcVar3 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pAVar2,pcVar3,"_on");
        Abc_NtkDupObj(pNtk_00,pObj,0);
        pAVar4 = (pObj->field_6).pCopy;
        if ((pObj->field_0x15 & 4) == 0) {
          pAVar2 = Abc_NtkCreateNodeConst0(pNtk_00);
        }
        else {
          pAVar2 = Abc_NtkCreateNodeConst1(pNtk_00);
        }
        goto LAB_0027e33f;
      }
      if ((pObj->vFanins).nSize < 1) {
        __assert_fail("Abc_ObjFaninNum(pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDsd.c"
                      ,0x293,"Abc_Ntk_t *Abc_NtkSparsifyInternal(Abc_Ntk_t *, int, int)");
      }
      for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
        Cudd_Srandom(0);
        Abc_NtkDupObj(pNtk_00,pAVar2,0);
        for (lVar5 = 0; nFanins = (pAVar2->vFanins).nSize, lVar5 < nFanins; lVar5 = lVar5 + 1) {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]] +
                           0x40));
        }
        bFunc = (DdNode *)((ulong)(((pAVar2->field_6).pCopy)->field_5).pData ^ uVar6);
        n = Abc_NtkSparsifyInternalOne(dd,bFunc,nFanins,nPerc);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,bFunc);
        (((pAVar2->field_6).pCopy)->field_5).pData = n;
        Abc_NtkDupObj(pNtk_00,pObj,0);
        Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar2->field_6).pCopy);
        pAVar4 = (pObj->field_6).pCopy;
        pcVar3 = Abc_ObjName(pObj);
        pSuffix = "_off";
        if (uVar6 == 0) {
          pSuffix = "_on";
        }
        Abc_ObjAssignName(pAVar4,pcVar3,pSuffix);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsifyInternal( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pDriver, * pFanin;
    DdNode * bFunc, * bFuncOld;
    DdManager * ddNew;
    int i, k, c;
    // start the new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // make sure the new manager has enough inputs
    ddNew = (DdManager *)pNtkNew->pManFunc;
    Cudd_bddIthVar( ddNew, Abc_NtkCiNum(pNtk)-1 );
    // go through the outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0( pObj );
        if ( Abc_ObjIsCi(pDriver) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, !Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        if ( Abc_ObjFaninNum(pDriver) == 0 )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        assert( Abc_ObjFaninNum(pObj) > 0 );
        // onset/offset
        for ( c = 0; c < 2; c++ )
        {
            Cudd_Srandom( 0 );
            Abc_NtkDupObj( pNtkNew, pDriver, 0 );
            Abc_ObjForEachFanin( pDriver, pFanin, k )
                Abc_ObjAddFanin( pDriver->pCopy, pFanin->pCopy );
            bFuncOld = Cudd_NotCond( (DdNode *)pDriver->pCopy->pData, c );
            bFunc = Abc_NtkSparsifyInternalOne( ddNew, bFuncOld, Abc_ObjFaninNum(pDriver), nPerc );  Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( ddNew, bFuncOld );
            pDriver->pCopy->pData = bFunc;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), (char*)(c ? "_off" : "_on") );
        }
    }
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    return pNtkNew;
}